

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

char * lj_str_find(char *s,char *p,MSize slen,MSize plen)

{
  char *__s1;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  char *local_48;
  
  if (plen <= slen) {
    if (plen == 0) {
      return s;
    }
    bVar1 = *p;
    uVar7 = slen - (plen - 1);
    do {
      bVar2 = true;
      if (uVar7 == 0) goto LAB_00110ff4;
      pcVar5 = (char *)memchr(s,(uint)bVar1,(ulong)uVar7);
      if (pcVar5 == (char *)0x0) {
        iVar6 = 3;
LAB_00110fe6:
        bVar3 = false;
      }
      else {
        __s1 = pcVar5 + 1;
        iVar4 = bcmp(__s1,p + 1,(ulong)(plen - 1));
        iVar6 = 0;
        if (iVar4 == 0) {
          iVar6 = 1;
          local_48 = pcVar5;
          goto LAB_00110fe6;
        }
        uVar7 = uVar7 + ((int)s - (int)__s1);
        bVar3 = true;
        s = __s1;
      }
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      bVar2 = bVar3;
    }
LAB_00110ff4:
    if (!bVar2) {
      return local_48;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_str_find(const char *s, const char *p, MSize slen, MSize plen)
{
  if (plen <= slen) {
    if (plen == 0) {
      return s;
    } else {
      int c = *(const uint8_t *)p++;
      plen--; slen -= plen;
      while (slen) {
	const char *q = (const char *)memchr(s, c, slen);
	if (!q) break;
	if (memcmp(q+1, p, plen) == 0) return q;
	q++; slen -= (MSize)(q-s); s = q;
      }
    }
  }
  return NULL;
}